

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall CP::queue<int>::print(queue<int> *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  queue<int> x;
  queue<int> local_40;
  
  queue(&local_40,this);
  poVar2 = std::operator<<((ostream *)&std::cout,"Queue size = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," Data = ");
  while (local_40.mSize != 0) {
    piVar3 = front(&local_40);
    iVar1 = *piVar3;
    pop(&local_40);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  ~queue(&local_40);
  return;
}

Assistant:

void print() {
      CP::queue<T> x(*this);
      std::cout << "Queue size = " << x.size() << " Data = ";
      while (x.empty() == false) {
        T a;
        a = x.front();
        x.pop();
        std::cout << a << " ";
      }
      std::cout << std::endl;
    }